

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::getMaxPatchVertices
          (ProgramInterfaceQueryTestCase *this)

{
  uint in_EAX;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint maxPatchVertices;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uStack_18 = (ulong)(uint)uStack_18;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8e7d,(long)&uStack_18 + 4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"getIntegerv(GL_MAX_PATCH_VERTICES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTestCase.cpp"
                  ,0x84f);
  return uStack_18._4_4_;
}

Assistant:

int ProgramInterfaceQueryTestCase::getMaxPatchVertices (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	glw::GLint				maxPatchVertices	= 0;

	gl.getIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_PATCH_VERTICES)");
	return maxPatchVertices;
}